

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool skipheader;
  bool useReturnPeriodFile;
  char cVar2;
  int iVar3;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  size_type *psVar4;
  char *pcVar5;
  pointer extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  char cVar7;
  pointer pcVar8;
  sigaction *unaff_R12;
  string *psVar9;
  long lVar10;
  char *pcVar11;
  undefined8 uVar12;
  allocator local_1eb;
  char local_1ea;
  char local_1e9;
  bool outputFlags [8];
  FILE *fout [2];
  FILE **local_1b0;
  string local_1a8;
  string parquetOutFiles [2];
  string local_148;
  string subfolder;
  string local_108;
  string local_e8;
  sigaction sa;
  
  pcVar8 = (pointer)(ulong)(uint)argc;
  fout[0] = (FILE *)0x0;
  fout[1] = (FILE *)0x0;
  outputFlags[0] = false;
  outputFlags[1] = false;
  outputFlags[2] = false;
  outputFlags[3] = false;
  outputFlags[4] = false;
  outputFlags[5] = false;
  outputFlags[6] = false;
  outputFlags[7] = false;
  parquetOutFiles[0]._M_dataplus._M_p = (pointer)&parquetOutFiles[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)parquetOutFiles,"");
  parquetOutFiles[1]._M_dataplus._M_p = (pointer)&parquetOutFiles[1].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(parquetOutFiles + 1),"");
  subfolder._M_dataplus._M_p = (pointer)&subfolder.field_2;
  subfolder._M_string_length = 0;
  subfolder.field_2._M_local_buf[0] = '\0';
  cVar7 = '\0';
  local_1b0 = fout;
  cVar2 = '\0';
  useReturnPeriodFile = false;
  bVar1 = false;
switchD_00110319_caseD_48:
  skipheader = bVar1;
  psVar4 = &subfolder._M_string_length;
  iVar3 = getopt(argc,argv,"vhrHFWMSK:fwsmO:o:P:p:");
  pcVar11 = _optarg;
  bVar1 = skipheader;
  if (iVar3 - 0x46U < 0x12) goto code_r0x001102fe;
  switch(iVar3) {
  case 0x66:
    outputFlags[4] = true;
    break;
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6e:
  case 0x71:
  case 0x74:
  case 0x75:
    goto switchD_00110319_caseD_47;
  case 0x68:
    goto switchD_0011033f_caseD_68;
  case 0x6d:
    outputFlags[7] = true;
    break;
  case 0x6f:
    unaff_R12 = &sa;
    std::__cxx11::string::string((string *)unaff_R12,_optarg,(allocator *)&local_1a8);
    openpipe(1,(string *)unaff_R12,fout);
    if (sa.__sigaction_handler.sa_handler != (__sighandler_t)(sa.sa_mask.__val + 1))
    goto LAB_00110408;
    goto switchD_00110319_caseD_48;
  case 0x70:
    psVar4 = &parquetOutFiles[1]._M_string_length;
    unaff_R12 = (sigaction *)(parquetOutFiles + 1);
    goto switchD_00110319_caseD_4b;
  case 0x72:
    useReturnPeriodFile = true;
    goto switchD_00110319_caseD_48;
  case 0x73:
    outputFlags[6] = true;
    break;
  case 0x76:
    goto switchD_0011033f_caseD_76;
  case 0x77:
    outputFlags[5] = true;
    goto LAB_00110427;
  default:
    if (iVar3 == -1) {
      local_1ea = cVar7;
      local_1e9 = cVar2;
      if (argc == 1) {
        main_cold_3();
      }
      psVar9 = parquetOutFiles;
      pcVar11 = &local_1e9;
      pcVar8 = (pointer)CONCAT71((uint7)(uint3)((uint)argc >> 8),1);
      unaff_R12 = (sigaction *)0x1118ac;
      goto LAB_001104e6;
    }
    goto switchD_00110319_caseD_47;
  }
  goto LAB_00110493;
code_r0x001102fe:
  unaff_R12 = (sigaction *)&subfolder;
  bVar1 = true;
  switch(iVar3) {
  case 0x46:
    outputFlags[0] = true;
    break;
  default:
    goto switchD_00110319_caseD_47;
  case 0x48:
    goto switchD_00110319_caseD_48;
  case 0x4d:
    outputFlags[3] = true;
    break;
  case 0x4f:
    unaff_R12 = &sa;
    std::__cxx11::string::string((string *)unaff_R12,_optarg,(allocator *)&local_1a8);
    openpipe(0,(string *)unaff_R12,fout);
    bVar1 = skipheader;
    if (sa.__sigaction_handler.sa_handler != (__sighandler_t)(sa.sa_mask.__val + 1)) {
LAB_00110408:
      unaff_R12 = &sa;
      operator_delete(sa.__sigaction_handler.sa_handler);
      bVar1 = skipheader;
    }
    goto switchD_00110319_caseD_48;
  case 0x50:
    psVar4 = &parquetOutFiles[0]._M_string_length;
    unaff_R12 = (sigaction *)parquetOutFiles;
  case 0x4b:
switchD_00110319_caseD_4b:
    pcVar5 = (char *)*psVar4;
    strlen(_optarg);
    std::__cxx11::string::_M_replace((ulong)unaff_R12,0,pcVar5,(ulong)pcVar11);
    bVar1 = skipheader;
    goto switchD_00110319_caseD_48;
  case 0x53:
    outputFlags[2] = true;
    break;
  case 0x57:
    outputFlags[1] = true;
LAB_00110427:
    cVar7 = '\x01';
    bVar1 = skipheader;
    goto switchD_00110319_caseD_48;
  }
LAB_00110493:
  cVar2 = '\x01';
  bVar1 = skipheader;
  goto switchD_00110319_caseD_48;
LAB_001104e6:
  sa.__sigaction_handler.sa_handler = (__sighandler_t)(sa.sa_mask.__val + 1);
  sa.sa_mask.__val[0] = 0;
  sa.sa_mask.__val[1]._0_1_ = 0;
  cVar7 = (char)pcVar8;
  pcVar5 = "PSEPT";
  if (cVar7 != '\0') {
    pcVar5 = "EPT";
  }
  std::__cxx11::string::_M_replace((ulong)&sa,0,(char *)0x0,(ulong)pcVar5);
  if (*pcVar11 == '\0') {
    if ((*local_1b0 != (FILE *)0x0) ||
       (iVar3 = std::__cxx11::string::compare((char *)psVar9), iVar3 != 0)) {
      main_cold_5();
    }
  }
  else if ((*local_1b0 == (FILE *)0x0) &&
          (iVar3 = std::__cxx11::string::compare((char *)psVar9), iVar3 == 0)) goto LAB_0011085a;
  iVar3 = std::__cxx11::string::compare((char *)psVar9);
  if (iVar3 != 0) goto LAB_00110848;
  if (sa.__sigaction_handler.sa_handler != (__sighandler_t)(sa.sa_mask.__val + 1)) {
    operator_delete(sa.__sigaction_handler.sa_handler);
  }
  pcVar11 = &local_1ea;
  psVar9 = parquetOutFiles + 1;
  local_1b0 = fout + 1;
  pcVar8 = (pointer)0x0;
  if (cVar7 == '\0') {
    progname = *argv;
    memset(&sa,0,0x98);
    sigemptyset((sigset_t *)&sa.sa_mask);
    sa.__sigaction_handler.sa_handler = segfault_sigaction;
    sa.sa_flags = 4;
    sigaction(0xb,(sigaction *)&sa,(sigaction *)0x0);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    initstreams(&local_e8,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    std::__cxx11::string::string((string *)&local_1a8,progname,&local_1eb);
    paVar6 = &local_148.field_2;
    local_148._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"INFO","");
    logprintf(&local_1a8,&local_148,"starting process..\n");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar6) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
    leccalc::doit(&subfolder,fout,useReturnPeriodFile,skipheader,outputFlags,true,parquetOutFiles,
                  progname);
    std::__cxx11::string::string((string *)&local_1a8,progname,&local_1eb);
    local_148._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"INFO","");
    logprintf(&local_1a8,&local_148,"finishing process..\n");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar6) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)subfolder._M_dataplus._M_p != &subfolder.field_2) {
      operator_delete(subfolder._M_dataplus._M_p);
    }
    lVar10 = 0;
    do {
      pcVar11 = *(char **)((long)&parquetOutFiles[1]._M_dataplus._M_p + lVar10);
      if (parquetOutFiles[1].field_2._M_local_buf + lVar10 != pcVar11) {
        operator_delete(pcVar11);
      }
      lVar10 = lVar10 + -0x20;
    } while (lVar10 != -0x40);
    return 0;
  }
  goto LAB_001104e6;
switchD_00110319_caseD_47:
  main_cold_8();
LAB_00110848:
  main_cold_6();
switchD_0011033f_caseD_76:
  main_cold_2();
switchD_0011033f_caseD_68:
  main_cold_1();
LAB_0011085a:
  main_cold_4();
  if ((sigaction *)local_148._M_dataplus._M_p != unaff_R12) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  if (local_1a8._M_dataplus._M_p != pcVar8) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if ((int)extraout_RDX == 1) {
    main_cold_7();
    uVar12 = extraout_RAX_00;
    if (parquetOutFiles[0]._M_dataplus._M_p != extraout_RDX) {
      operator_delete(parquetOutFiles[0]._M_dataplus._M_p);
    }
  }
  else {
    paVar6 = &parquetOutFiles[1].field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)subfolder._M_dataplus._M_p != &subfolder.field_2) {
      operator_delete(subfolder._M_dataplus._M_p);
    }
    lVar10 = -0x40;
    do {
      pcVar8 = (((string *)(paVar6 + -1))->_M_dataplus)._M_p;
      if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar8) {
        operator_delete(pcVar8);
      }
      paVar6 = paVar6 + -2;
      lVar10 = lVar10 + 0x20;
      uVar12 = extraout_RAX;
    } while (lVar10 != 0);
  }
  _Unwind_Resume(uVar12);
}

Assistant:

int main(int argc, char* argv[])
{
	bool useReturnPeriodFile = false;
	FILE* fout[] = { nullptr, nullptr };
	bool outputFlags[8] = { false, false, false, false,
				false, false, false, false };
	const int maxStreams = 2;
	std::string parquetOutFiles[maxStreams] = { "", "" };
	bool outputStreams[maxStreams] = { false, false };
	const bool ordFlag = true;   // Turn on ORD output

	std::string subfolder;
	int opt;
	bool skipheader = false;
	while ((opt = getopt(argc, argv, "vhrHFWMSK:fwsmO:o:P:p:")) != -1) {
		switch (opt) {
		case 'K':
			subfolder = optarg;
			break;
		case 'H':
			skipheader = true;
			break;
		case 'F':
			outputFlags[AGG_FULL_UNCERTAINTY] = true;
			outputStreams[EPT] = true;
			break;
		case 'f':
			outputFlags[OCC_FULL_UNCERTAINTY] = true;
			outputStreams[EPT] = true;
			break;
		case 'W':
			outputFlags[AGG_WHEATSHEAF] = true;
			outputStreams[PSEPT] = true;
			break;
		case 'w':
			outputFlags[OCC_WHEATSHEAF] = true;
			outputStreams[PSEPT] = true;
			break;
		case 'S':
			outputFlags[AGG_SAMPLE_MEAN] = true;
			outputStreams[EPT] = true;
			break;
		case 's':
			outputFlags[OCC_SAMPLE_MEAN] = true;
			outputStreams[EPT] = true;
			break;
		case 'M':
			outputFlags[AGG_WHEATSHEAF_MEAN] = true;
			outputStreams[EPT] = true;
			break;
		case 'm':
			outputFlags[OCC_WHEATSHEAF_MEAN] = true;
			outputStreams[EPT] = true;
			break;
		case 'r':
			useReturnPeriodFile = true;
			break;
		case 'O':
			openpipe(EPT, optarg, fout);
			break;
		case 'o':
			openpipe(PSEPT, optarg, fout);
			break;
		case 'P':
			parquetOutFiles[EPT] = optarg;
			break;
		case 'p':
			parquetOutFiles[PSEPT] = optarg;
			break;
		case 'v':
#ifdef HAVE_PARQUET
			fprintf(stderr, "%s : version: %s : "
					"Parquet output enabled\n",
				argv[0], VERSION);
#else
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
#endif
			exit(EXIT_FAILURE);
			break;
		case 'h':
			help();
			::exit(EXIT_FAILURE);
			break;
		default:
			help();
			::exit(EXIT_FAILURE);
		}
	}

	if (argc == 1) {
		fprintf(stderr, "FATAL: Invalid parameters\n");
		help();
	}

	// Check for valid combinations of output streams and ORD files
	for (int i = 0; i < maxStreams; i++) {
		std::string streamName;
		if (i == EPT) streamName = "EPT";
		else if (i == PSEPT) streamName = "PSEPT";
		else streamName = "Error";   // Should never get here

		if (outputStreams[i] == false && 
		    (fout[i] != nullptr || parquetOutFiles[i] != "")) {
			fprintf(stderr, "WARNING: no valid output stream to fill %s file.\n",
				streamName.c_str());
		} else if (outputStreams[i] == true && fout[i] == nullptr
			   && parquetOutFiles[i] == "") {
			fprintf(stderr, "FATAL: no destination for %s output.\n",
				streamName.c_str());
			exit(EXIT_FAILURE);
		}
#ifndef HAVE_PARQUET
		if (parquetOutFiles[i] != "") {
			fprintf(stderr, "FATAL: Apache arrow libraries for "
					"parquet output are missing.\n Please "
					"install libraries and recompile to "
					"use this option.\n");
			exit(EXIT_FAILURE);
		}
#endif
	}

	progname = argv[0];
#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif

	try {
		initstreams();
        	logprintf(progname, "INFO", "starting process..\n");
		leccalc::doit(subfolder, fout, useReturnPeriodFile, skipheader,
			      outputFlags, ordFlag, parquetOutFiles, progname);
        	logprintf(progname, "INFO", "finishing process..\n");
		return EXIT_SUCCESS;
	} catch (std::bad_alloc&) {
		fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
		exit(EXIT_FAILURE);
	}

}